

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManIncrSimSet(Gia_Man_t *p,Vec_Int_t *vObjLits)

{
  uint uVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  word *pwVar6;
  Gia_Obj_t *pGVar7;
  int i;
  
  iVar3 = vObjLits->nSize;
  if (0 < iVar3) {
    p->iTimeStamp = p->iTimeStamp + 1;
    for (i = 0; i < iVar3; i = i + 1) {
      iVar3 = Vec_IntEntry(vObjLits,i);
      iVar4 = Abc_Lit2Var(iVar3);
      pwVar6 = Gia_ManBuiltInData(p,iVar4);
      iVar4 = Abc_Lit2Var(iVar3);
      pGVar7 = Gia_ManObj(p,iVar4);
      if ((int)*(uint *)pGVar7 < 0 || (~*(uint *)pGVar7 & 0x1fffffff) == 0) {
        p_00 = p->vTimeStamps;
        iVar4 = Abc_Lit2Var(iVar3);
        Vec_IntWriteEntry(p_00,iVar4,p->iTimeStamp);
        uVar1 = p->iPatsPi;
        uVar2 = pwVar6[(int)uVar1 >> 6];
        uVar5 = Abc_LitIsCompl(iVar3);
        if (((uVar2 >> ((ulong)uVar1 & 0x3f) & 1) != 0) == uVar5) {
          pwVar6[p->iPatsPi >> 6] = pwVar6[p->iPatsPi >> 6] ^ 1L << ((byte)p->iPatsPi & 0x3f);
        }
      }
      iVar3 = vObjLits->nSize;
    }
    iVar3 = 0;
    if (p->iPatsPi != p->nSimWords * 0x40 + -1) {
      iVar3 = p->iPatsPi + 1;
    }
    p->iPatsPi = iVar3;
    return;
  }
  __assert_fail("Vec_IntSize(vObjLits) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x499,"void Gia_ManIncrSimSet(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManIncrSimSet( Gia_Man_t * p, Vec_Int_t * vObjLits )
{
    int i, iLit; 
    assert( Vec_IntSize(vObjLits) > 0 );
    p->iTimeStamp++;
    Vec_IntForEachEntry( vObjLits, iLit, i )
    {
        word * pSims = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
            continue;
        //assert( Vec_IntEntry(p->vTimeStamps, Abc_Lit2Var(iLit)) == p->iTimeStamp-1 );
        Vec_IntWriteEntry(p->vTimeStamps, Abc_Lit2Var(iLit), p->iTimeStamp);
        if ( Abc_TtGetBit(pSims, p->iPatsPi) == Abc_LitIsCompl(iLit) )
             Abc_TtXorBit(pSims, p->iPatsPi);
    }
    p->iPatsPi = (p->iPatsPi == p->nSimWords * 64 - 1) ? 0 : p->iPatsPi + 1;
}